

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall wasm::Type::isNull(Type *this)

{
  uint uVar1;
  HeapType HVar2;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    HVar2 = getHeapType(this);
    if (HVar2.id < 0x7d) {
      uVar1 = (uint)HVar2.id & 0x7b;
      return (uVar1 << 0x1d | uVar1 - 8 >> 3) - 10 < 5;
    }
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }